

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O0

int arkSetInterpolantType(void *arkode_mem,int itype)

{
  ARKInterp p_Var1;
  int in_ESI;
  ARKodeMem in_RDI;
  int unaff_retaddr;
  ARKodeMem ark_mem;
  ARKInterp in_stack_ffffffffffffffd8;
  int local_4;
  
  if (in_RDI == (ARKodeMem)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode","arkSetInterpolantType",
                    "arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if ((in_ESI == 0) || (in_ESI == 1)) {
    if (in_RDI->initialized == 0) {
      if (in_RDI->interp != (ARKInterp)0x0) {
        arkInterpFree(in_RDI,in_stack_ffffffffffffffd8);
        in_RDI->interp = (ARKInterp)0x0;
      }
      if (in_ESI == 0) {
        p_Var1 = arkInterpCreate_Hermite(ark_mem,unaff_retaddr);
        in_RDI->interp = p_Var1;
      }
      else {
        p_Var1 = arkInterpCreate_Lagrange(ark_mem,unaff_retaddr);
        in_RDI->interp = p_Var1;
      }
      if (in_RDI->interp == (ARKInterp)0x0) {
        arkProcessError(in_RDI,-0x14,"ARKode","arkSetInterpolantType",
                        "Unable to allocate interpolation structure");
        local_4 = -0x14;
      }
      else {
        local_4 = 0;
      }
    }
    else {
      arkProcessError(in_RDI,-0x28,"ARKode","arkSetInterpolantType",
                      "Type cannot be specified after module initialization.");
      local_4 = -0x16;
    }
  }
  else {
    arkProcessError(in_RDI,-0x16,"ARKode","arkSetInterpolantType",
                    "Illegal interpolation type input.");
    local_4 = -0x16;
  }
  return local_4;
}

Assistant:

int arkSetInterpolantType(void *arkode_mem, int itype)
{
  ARKodeMem ark_mem;
  if (arkode_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkSetInterpolantType", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;

  /* check for legal itype input */
  if ((itype != ARK_INTERP_HERMITE) && (itype != ARK_INTERP_LAGRANGE)) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode",
                    "arkSetInterpolantType",
                    "Illegal interpolation type input.");
    return(ARK_ILL_INPUT);
  }

  /* do not change type once the module has been initialized */
  if (ark_mem->initialized) {
    arkProcessError(ark_mem, ARK_INTERP_FAIL, "ARKode",
                    "arkSetInterpolantType",
                    "Type cannot be specified after module initialization.");
    return(ARK_ILL_INPUT);
  }

  /* delete any existing interpolation module */
  if (ark_mem->interp != NULL) {
    arkInterpFree(ark_mem, ark_mem->interp);
    ark_mem->interp = NULL;
  }

  /* create requested interpolation module, initially specifying
     the maximum possible interpolant degree. */
  if (itype == ARK_INTERP_HERMITE) {
    ark_mem->interp = arkInterpCreate_Hermite(arkode_mem, ARK_INTERP_MAX_DEGREE);
  } else {
    ark_mem->interp = arkInterpCreate_Lagrange(arkode_mem, ARK_INTERP_MAX_DEGREE);
  }
  if (ark_mem->interp == NULL) {
    arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode", "arkSetInterpolantType",
                    "Unable to allocate interpolation structure");
    return(ARK_MEM_FAIL);
  }

  return(ARK_SUCCESS);
}